

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrunsym.cpp
# Opt level: O0

void __thiscall
CVmRuntimeSymbols::add_sym(CVmRuntimeSymbols *this,char *sym,size_t len,vm_val_t *val)

{
  size_t __size;
  undefined8 *puVar1;
  undefined8 *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  vm_runtime_sym *new_sym;
  
  __size = osrndsz(in_RDX + 0x50);
  puVar1 = (undefined8 *)malloc(__size);
  puVar1[3] = *in_RCX;
  puVar1[4] = in_RCX[1];
  puVar1[2] = in_RDX;
  puVar1[1] = puVar1 + 10;
  memcpy(puVar1 + 10,in_RSI,in_RDX);
  puVar1[6] = 0;
  puVar1[7] = 0;
  *(undefined4 *)(puVar1 + 8) = 0;
  puVar1[9] = 0;
  *(undefined4 *)(puVar1 + 5) = 0;
  *puVar1 = 0;
  if (in_RDI[1] == 0) {
    *in_RDI = puVar1;
  }
  else {
    *(undefined8 **)in_RDI[1] = puVar1;
  }
  in_RDI[1] = puVar1;
  in_RDI[2] = in_RDI[2] + 1;
  return;
}

Assistant:

void CVmRuntimeSymbols::add_sym(const char *sym, size_t len,
                                const vm_val_t *val)
{
    vm_runtime_sym *new_sym;
    
    /* allocate a new structure */
    new_sym = (vm_runtime_sym *)t3malloc(osrndsz(
        sizeof(vm_runtime_sym) + len));

    /* copy the data */
    new_sym->val = *val;
    new_sym->len = len;
    memcpy(new_sym->sym = (char *)(new_sym + 1), sym, len);

    /* there are no macro parameters */
    new_sym->macro_expansion = 0;
    new_sym->macro_exp_len = 0;
    new_sym->macro_argc = 0;
    new_sym->macro_args = 0;
    new_sym->macro_flags = 0;

    /* link it into our list */
    new_sym->nxt = 0;
    if (tail_ == 0)
        head_ = new_sym;
    else
        tail_->nxt = new_sym;

    /* it's the new tail */
    tail_ = new_sym;

    /* count it */
    ++cnt_;
}